

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O2

void DspReverb_Reset(DspReverb *reverb)

{
  long lVar1;
  DspAllPass *pDVar2;
  long lVar3;
  DspBiQuad *pDVar4;
  DspBiQuad *filter;
  bool bVar5;
  
  DspDelay_Reset(&reverb->early_delay);
  DspDelay_Reset(&reverb->apf_in[0].delay);
  pDVar4 = &reverb->channel[0].lpf_comb[0].high_shelving;
  pDVar2 = reverb->channel[0].apf_out;
  for (lVar3 = 0; lVar3 < reverb->reverb_channels; lVar3 = lVar3 + 1) {
    DspDelay_Reset(&reverb->channel[lVar3].reverb_delay);
    lVar1 = 8;
    filter = pDVar4;
    while (bVar5 = lVar1 != 0, lVar1 = lVar1 + -1, bVar5) {
      DspDelay_Reset((DspDelay *)&filter[-2].sampleRate);
      DspBiQuad_Reset(filter + -1);
      DspBiQuad_Reset(filter);
      filter = (DspBiQuad *)(filter[2].delay + 1);
    }
    DspBiQuad_Reset((DspBiQuad *)(&reverb->channel[lVar3].reverb_delay + 0x26));
    for (lVar1 = 0; lVar1 != 0xa0; lVar1 = lVar1 + 0x28) {
      DspDelay_Reset((DspDelay *)((long)&(pDVar2->delay).sampleRate + lVar1));
    }
    pDVar4 = (DspBiQuad *)(pDVar4[0x1c].delay + 1);
    pDVar2 = (DspAllPass *)((long)(pDVar2 + 0x1f) + 0x20);
  }
  return;
}

Assistant:

void DspReverb_Reset(DspReverb *reverb)
{
	int32_t i, c;

	DspDelay_Reset(&reverb->early_delay);

	for (i = 0; i < REVERB_COUNT_APF_IN; ++i)
	{
		DspAllPass_Reset(&reverb->apf_in[i]);
	}

	for (c = 0; c < reverb->reverb_channels; ++c)
	{
		DspDelay_Reset(&reverb->channel[c].reverb_delay);

		for (i = 0; i < REVERB_COUNT_COMB; ++i)
		{
			DspCombShelving_Reset(&reverb->channel[c].lpf_comb[i]);
		}

		DspBiQuad_Reset(&reverb->channel[c].room_high_shelf);

		for (i = 0; i < REVERB_COUNT_APF_OUT; ++i)
		{
			DspAllPass_Reset(&reverb->channel[c].apf_out[i]);
		}
	}
}